

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void msgpack11::anon_unknown_0::dump_data<unsigned_int>(uint value,string *out)

{
  iterator __first;
  iterator __last;
  reverse_iterator<unsigned_char_*> local_48;
  reverse_iterator<unsigned_char_*> local_40 [2];
  string *local_30;
  anon_class_8_1_ba1d6aae local_28;
  anon_class_8_1_ba1d6aae f;
  EndianConverter<unsigned_int> converter;
  string *out_local;
  uint value_local;
  
  local_28.out = out;
  f.out._4_4_ = value;
  if (((anonymous_namespace)::is_big_endian & 1) == 0) {
    std::array<unsigned_char,_4UL>::rbegin((array<unsigned_char,_4UL> *)local_40);
    std::array<unsigned_char,_4UL>::rend((array<unsigned_char,_4UL> *)&local_48);
    std::
    for_each<std::reverse_iterator<unsigned_char*>,msgpack11::(anonymous_namespace)::dump_data<unsigned_int>(unsigned_int,std::__cxx11::string&)::_lambda(unsigned_char)_1_>
              (local_40,&local_48,local_28);
  }
  else {
    __first = std::array<unsigned_char,_4UL>::begin((array<unsigned_char,_4UL> *)((long)&f.out + 4))
    ;
    __last = std::array<unsigned_char,_4UL>::end((array<unsigned_char,_4UL> *)((long)&f.out + 4));
    local_30 = local_28.out;
    std::
    for_each<unsigned_char*,msgpack11::(anonymous_namespace)::dump_data<unsigned_int>(unsigned_int,std::__cxx11::string&)::_lambda(unsigned_char)_1_>
              (__first,__last,local_28);
  }
  return;
}

Assistant:

void dump_data(T value, std::string &out)
{
    EndianConverter<T> converter;
    converter.value.packed = value;

    auto f = [&](uint8_t byte) {
        out.push_back(byte);
    };

    if(is_big_endian)
    {
        std::for_each(converter.value.bytes.begin(), converter.value.bytes.end(), f);
    }
    else
    {
        std::for_each(converter.value.bytes.rbegin(), converter.value.bytes.rend(), f);
    }
}